

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf.cpp
# Opt level: O2

Complex __thiscall libDAI::MF::logZ(MF *this)

{
  int iVar1;
  undefined4 extraout_var;
  ulong uVar2;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TFactor<double> *this_00;
  long *plVar3;
  size_t i;
  ulong uVar4;
  undefined1 auVar5 [16];
  Factor henk;
  Factor piet;
  Factor local_d8;
  TFactor<double> local_a0;
  TFactor<double> local_68;
  
  uVar4 = 0;
  while( true ) {
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    uVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x28))
                      ((long *)CONCAT44(extraout_var,iVar1));
    if (uVar2 <= uVar4) break;
    beliefV(&local_d8,this,uVar4);
    TProb<double>::entropy(&local_d8._p);
    TFactor<double>::~TFactor(&local_d8);
    uVar4 = uVar4 + 1;
  }
  uVar4 = 0;
  while( true ) {
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    auVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x48))
                       ((long *)CONCAT44(extraout_var_00,iVar1));
    if (auVar5._0_8_ <= uVar4) break;
    TFactor<double>::TFactor(&local_d8);
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    plVar3 = *(long **)(*(long *)(CONCAT44(extraout_var_01,iVar1) + 0x88) + uVar4 * 0x18);
    while( true ) {
      iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      if (plVar3 == *(long **)(*(long *)(CONCAT44(extraout_var_02,iVar1) + 0x88) + 8 + uVar4 * 0x18)
         ) break;
      TFactor<double>::operator*=
                (&local_d8,
                 (this->_beliefs).
                 super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + *plVar3);
      plVar3 = plVar3 + 1;
    }
    TProb<double>::normalize(&local_d8._p,NORMPROB);
    TFactor<double>::TFactor(&local_a0);
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    this_00 = (TFactor<double> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar1) + 0x50))
                        ((long *)CONCAT44(extraout_var_03,iVar1),uVar4);
    TFactor<double>::log0(&local_68,this_00);
    TFactor<double>::operator=(&local_a0,&local_68);
    TFactor<double>::~TFactor(&local_68);
    TFactor<double>::operator*=(&local_a0,&local_d8);
    TProb<double>::totalSum(&local_a0._p);
    TFactor<double>::~TFactor(&local_a0);
    TFactor<double>::~TFactor(&local_d8);
    uVar4 = uVar4 + 1;
  }
  return (Complex)(_ComplexT)auVar5;
}

Assistant:

Complex MF::logZ() const {
        Complex sum = 0.0;
        
        for(size_t i=0; i < grm().nrVars(); i++ )
            sum -= beliefV(i).entropy();
        for(size_t I=0; I < grm().nrFactors(); I++ ) {
            Factor henk;
            for( FactorGraph::nb_cit j = grm().nbF(I).begin(); j != grm().nbF(I).end(); j++ )   // for all j in I
                henk *= _beliefs[*j];
            henk.normalize();
            Factor piet;
            piet = grm().factor(I).log0();
            piet *= henk;
            sum -= Complex( piet.totalSum() );
        }

        return -sum;
    }